

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::QualifiedClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *d,Options *options)

{
  cpp *this_00;
  Options *in_R9;
  string_view name;
  string local_40;
  
  this_00 = *(cpp **)(this + 0x18);
  ClassName_abi_cxx11_(&local_40,this,d);
  name._M_str = (char *)d;
  name._M_len = (size_t)local_40._M_dataplus._M_p;
  QualifiedFileLevelSymbol_abi_cxx11_
            (__return_storage_ptr__,this_00,(FileDescriptor *)local_40._M_string_length,name,in_R9);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedClassName(const Descriptor* d, const Options& options) {
  return QualifiedFileLevelSymbol(d->file(), ClassName(d), options);
}